

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O0

SourceLocation
slang::getMatchingMacroLoc
          (SourceManager *sm,SourceLocation loc,SourceLocation contextLoc,bool isStart,
          span<const_slang::BufferID,_18446744073709551615UL> commonArgs)

{
  span<const_slang::BufferID,_18446744073709551615UL> commonArgs_00;
  span<const_slang::BufferID,_18446744073709551615UL> commonArgs_01;
  bool bVar1;
  BufferID BVar2;
  BufferID BVar3;
  SourceLocation SVar4;
  undefined1 in_CL;
  SourceLocation in_RDX;
  SourceLocation in_RSI;
  pointer in_RDI;
  __extent_storage<18446744073709551615UL> in_R8;
  SourceLocation in_R9;
  SourceLocation argLoc;
  SourceLocation macroLoc;
  SourceLocation orig_1;
  SourceLocation orig;
  SourceRange macroArgRange;
  SourceRange macroRange;
  SourceRange *in_stack_fffffffffffffea0;
  SourceLocation *in_stack_fffffffffffffea8;
  SourceManager *in_stack_fffffffffffffec8;
  SourceLocation in_stack_fffffffffffffed0;
  SourceLocation in_stack_fffffffffffffed8;
  SourceLocation in_stack_fffffffffffffee0;
  SourceRange local_f8;
  SourceLocation local_e0;
  SourceRange local_d0;
  SourceRange local_b8;
  SourceLocation local_a8;
  SourceLocation local_a0;
  SourceRange local_98;
  SourceLocation local_80;
  uint32_t local_74 [3];
  SourceRange local_68;
  SourceRange local_58;
  undefined1 isStart_00;
  undefined3 in_stack_ffffffffffffffcc;
  uint uVar5;
  SourceLocation local_8;
  
  uVar5 = CONCAT13(in_CL,in_stack_ffffffffffffffcc) & 0x1ffffff;
  BVar2 = SourceLocation::buffer(in_stack_fffffffffffffea8);
  BVar3 = SourceLocation::buffer(in_stack_fffffffffffffea8);
  isStart_00 = (undefined1)(BVar3.id >> 0x18);
  bVar1 = BufferID::operator==
                    ((BufferID *)&stack0xffffffffffffffc8,(BufferID *)&stack0xffffffffffffffc4);
  SVar4 = in_RSI;
  if (!bVar1) {
    bVar1 = SourceManager::isMacroLoc(in_stack_fffffffffffffec8,in_stack_fffffffffffffed0);
    if (bVar1) {
      SourceRange::SourceRange(in_stack_fffffffffffffea0);
      SourceRange::SourceRange(in_stack_fffffffffffffea0);
      bVar1 = SourceManager::isMacroArgLoc(in_stack_fffffffffffffec8,in_stack_fffffffffffffed0);
      if (bVar1) {
        local_74[0] = (uint32_t)SourceLocation::buffer(in_stack_fffffffffffffea8);
        bVar1 = std::ranges::__binary_search_fn::
                operator()<std::span<const_slang::BufferID,_18446744073709551615UL>_&,_slang::BufferID,_std::identity,_std::ranges::less>
                          ((__binary_search_fn *)&std::ranges::binary_search,
                           &stack0xffffffffffffffd8,local_74);
        if (bVar1) {
          local_a8 = SourceManager::getOriginalLoc
                               ((SourceManager *)in_stack_fffffffffffffed0,in_stack_fffffffffffffed8
                               );
          local_a0 = local_a8;
          local_80 = local_a8;
          SourceRange::SourceRange(&local_98,local_a8,local_a8);
          local_58.startLoc = local_98.startLoc;
          local_58.endLoc = local_98.endLoc;
        }
        local_b8 = SourceManager::getExpansionRange
                             ((SourceManager *)in_stack_fffffffffffffed8,in_stack_fffffffffffffee0);
        local_68.startLoc = local_b8.startLoc;
        local_68.endLoc = local_b8.endLoc;
      }
      else {
        local_d0 = SourceManager::getExpansionRange
                             ((SourceManager *)in_stack_fffffffffffffed8,in_stack_fffffffffffffee0);
        local_58.startLoc = local_d0.startLoc;
        local_58.endLoc = local_d0.endLoc;
        local_e0 = SourceManager::getOriginalLoc
                             ((SourceManager *)in_stack_fffffffffffffed0,in_stack_fffffffffffffed8);
        SourceRange::SourceRange(&local_f8,local_e0,local_e0);
        local_68.startLoc = local_f8.startLoc;
        local_68.endLoc = local_f8.endLoc;
      }
      if ((uVar5 & 0x1000000) == 0) {
        SourceRange::end(&local_58);
      }
      else {
        SourceRange::start(&local_58);
      }
      bVar1 = SourceLocation::operator_cast_to_bool((SourceLocation *)0x637d86);
      if (bVar1) {
        commonArgs_00._M_extent._M_extent_value = in_R8._M_extent_value;
        commonArgs_00._M_ptr = in_RDI;
        SVar4 = getMatchingMacroLoc((SourceManager *)CONCAT44(uVar5,BVar2.id),in_RDX,in_R9,
                                    (bool)isStart_00,commonArgs_00);
        bVar1 = SourceLocation::operator_cast_to_bool((SourceLocation *)0x637e06);
        if (bVar1) {
          return SVar4;
        }
      }
      if ((uVar5 & 0x1000000) == 0) {
        SourceRange::end(&local_68);
      }
      else {
        SourceRange::start(&local_68);
      }
      commonArgs_01._M_extent._M_extent_value = in_R8._M_extent_value;
      commonArgs_01._M_ptr = in_RDI;
      SVar4 = getMatchingMacroLoc((SourceManager *)CONCAT44(uVar5,BVar2.id),in_RDX,in_R9,
                                  (bool)isStart_00,commonArgs_01);
    }
    else {
      SourceLocation::SourceLocation(&local_8);
      SVar4 = local_8;
    }
  }
  local_8 = SVar4;
  return local_8;
}

Assistant:

static SourceLocation getMatchingMacroLoc(const SourceManager& sm, SourceLocation loc,
                                          SourceLocation contextLoc, bool isStart,
                                          std::span<const BufferID> commonArgs) {
    if (loc.buffer() == contextLoc.buffer())
        return loc;

    if (!sm.isMacroLoc(loc))
        return {};

    SourceRange macroRange;
    SourceRange macroArgRange;
    if (sm.isMacroArgLoc(loc)) {
        // Only look at the original location of this argument if the other location
        // in the range is also present in the expansion.
        if (std::ranges::binary_search(commonArgs, loc.buffer())) {
            SourceLocation orig = sm.getOriginalLoc(loc);
            macroRange = SourceRange(orig, orig);
        }
        macroArgRange = sm.getExpansionRange(loc);
    }
    else {
        macroRange = sm.getExpansionRange(loc);

        SourceLocation orig = sm.getOriginalLoc(loc);
        macroArgRange = SourceRange(orig, orig);
    }

    SourceLocation macroLoc = isStart ? macroRange.start() : macroRange.end();
    if (macroLoc) {
        macroLoc = getMatchingMacroLoc(sm, macroLoc, contextLoc, isStart, commonArgs);
        if (macroLoc)
            return macroLoc;
    }

    SourceLocation argLoc = isStart ? macroArgRange.start() : macroArgRange.end();
    return getMatchingMacroLoc(sm, argLoc, contextLoc, isStart, commonArgs);
}